

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

void ktxHashList_ConstructCopy(ktxHashList *pHead,ktxHashList orig)

{
  ktxHashListEntry *in_RSI;
  undefined8 *in_RDI;
  ktxHashListEntry *entry;
  void *in_stack_00000040;
  uint in_stack_0000004c;
  char *in_stack_00000050;
  ktxHashList *in_stack_00000058;
  undefined8 local_18;
  
  *in_RDI = 0;
  for (local_18 = in_RSI; local_18 != (ktxHashListEntry *)0x0; local_18 = ktxHashList_Next(local_18)
      ) {
    ktxHashList_AddKVPair(in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  return;
}

Assistant:

void
ktxHashList_ConstructCopy(ktxHashList* pHead, ktxHashList orig)
{
    ktxHashListEntry* entry = orig;
    *pHead = NULL;
    for (; entry != NULL; entry = ktxHashList_Next(entry)) {
        (void)ktxHashList_AddKVPair(pHead,
                                    entry->key, entry->valueLen, entry->value);
    }
}